

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_UUID_struct>::Append(ON_SimpleArray<ON_UUID_struct> *this,ON_UUID_struct *x)

{
  ON_UUID_struct *pOVar1;
  int iVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  ON_UUID_struct *memblock;
  int iVar6;
  uint uVar7;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if (iVar2 < 8 || (ulong)((long)iVar2 << 4) < 0x10000001) {
      uVar7 = 4;
      if (2 < iVar2) {
        uVar7 = iVar2 * 2;
      }
    }
    else {
      iVar6 = 0x1000008;
      if (iVar2 < 0x1000008) {
        iVar6 = iVar2;
      }
      uVar7 = iVar6 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_UUID_struct *)onmalloc(0x10);
      uVar4 = x->Data2;
      uVar5 = x->Data3;
      uVar3 = *(undefined8 *)x->Data4;
      memblock->Data1 = x->Data1;
      memblock->Data2 = uVar4;
      memblock->Data3 = uVar5;
      *(undefined8 *)memblock->Data4 = uVar3;
    }
    if ((uint)this->m_capacity < uVar7) {
      SetCapacity(this,(long)(int)uVar7);
    }
    if (this->m_a == (ON_UUID_struct *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  uVar4 = memblock->Data2;
  uVar5 = memblock->Data3;
  uVar3 = *(undefined8 *)memblock->Data4;
  pOVar1 = this->m_a + iVar2;
  pOVar1->Data1 = memblock->Data1;
  pOVar1->Data2 = uVar4;
  pOVar1->Data3 = uVar5;
  *(undefined8 *)pOVar1->Data4 = uVar3;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}